

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absDup.c
# Opt level: O3

Vec_Int_t * Gia_GlaCollectAssigned(Gia_Man_t *p,Vec_Int_t *vGateClasses)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  uint uVar7;
  size_t sVar8;
  Gia_Obj_t *pGVar9;
  long lVar10;
  long lVar11;
  size_t __nmemb;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar6 = (int *)malloc(4000);
  p_00->pArray = piVar6;
  if (0 < vGateClasses->nSize) {
    lVar10 = 0;
    lVar11 = 0;
    do {
      if (vGateClasses->pArray[lVar11] != 0) {
        if (vGateClasses->pArray[lVar11] < 1) {
          __assert_fail("Entry > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                        ,0x83,"Vec_Int_t *Gia_GlaCollectAssigned(Gia_Man_t *, Vec_Int_t *)");
        }
        if (p->nObjs <= lVar11) {
LAB_00601015:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar2 = p->pObjs;
        Vec_IntPush(p_00,(int)lVar11);
        uVar3 = *(ulong *)(&pGVar2->field_0x0 + lVar10);
        uVar7 = (uint)uVar3;
        if ((~uVar7 & 0x1fffffff) == 0 || (int)uVar7 < 0) {
          if ((~uVar7 & 0x9fffffff) == 0) {
            uVar7 = (uint)(uVar3 >> 0x20) & 0x1fffffff;
            iVar5 = p->vCis->nSize;
            if (iVar5 - p->nRegs <= (int)uVar7) {
              iVar1 = p->vCos->nSize;
              uVar7 = (iVar1 - iVar5) + uVar7;
              if (((int)uVar7 < 0) || (iVar1 <= (int)uVar7)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              iVar5 = p->vCos->pArray[uVar7];
              if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_00601015;
              uVar7 = (uint)*(undefined8 *)(p->pObjs + iVar5);
              goto LAB_00600f6e;
            }
          }
          if ((~uVar3 & 0x1fffffff1fffffff) != 0) {
            __assert_fail("Gia_ObjIsConst0(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                          ,0x8d,"Vec_Int_t *Gia_GlaCollectAssigned(Gia_Man_t *, Vec_Int_t *)");
          }
        }
        else {
          pGVar9 = (Gia_Obj_t *)(&pGVar2->field_0x0 + lVar10);
          pGVar4 = p->pObjs;
          if ((pGVar9 < pGVar4) || (pGVar4 + p->nObjs <= pGVar9)) {
LAB_00600ff6:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00,(int)((ulong)((long)pGVar2 + (lVar10 - (long)pGVar4)) >> 2) * -0x55555555
                           - (uVar7 & 0x1fffffff));
          pGVar4 = p->pObjs;
          if ((pGVar9 < pGVar4) || (pGVar4 + p->nObjs <= pGVar9)) goto LAB_00600ff6;
          iVar5 = (int)((ulong)((long)pGVar2 + (lVar10 - (long)pGVar4)) >> 2) * -0x55555555;
          uVar7 = *(uint *)(&pGVar2->field_0x4 + lVar10);
LAB_00600f6e:
          Vec_IntPush(p_00,iVar5 - (uVar7 & 0x1fffffff));
        }
      }
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 0xc;
    } while (lVar11 < vGateClasses->nSize);
    __nmemb = (size_t)p_00->nSize;
    if (1 < (long)__nmemb) {
      piVar6 = p_00->pArray;
      qsort(piVar6,__nmemb,4,Vec_IntSortCompare1);
      iVar5 = 1;
      sVar8 = 1;
      do {
        if (piVar6[sVar8] != piVar6[sVar8 - 1]) {
          lVar10 = (long)iVar5;
          iVar5 = iVar5 + 1;
          piVar6[lVar10] = piVar6[sVar8];
        }
        sVar8 = sVar8 + 1;
      } while (__nmemb != sVar8);
      p_00->nSize = iVar5;
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_GlaCollectAssigned( Gia_Man_t * p, Vec_Int_t * vGateClasses )
{
    Vec_Int_t * vAssigned;
    Gia_Obj_t * pObj;
    int i, Entry;
    vAssigned = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntry( vGateClasses, Entry, i )
    {
        if ( Entry == 0 )
            continue;
        assert( Entry > 0 );
        pObj = Gia_ManObj( p, i );
        Vec_IntPush( vAssigned, Gia_ObjId(p, pObj) );
        if ( Gia_ObjIsAnd(pObj) )
        {
            Vec_IntPush( vAssigned, Gia_ObjFaninId0p(p, pObj) );
            Vec_IntPush( vAssigned, Gia_ObjFaninId1p(p, pObj) );
        }
        else if ( Gia_ObjIsRo(p, pObj) )
            Vec_IntPush( vAssigned, Gia_ObjFaninId0p(p, Gia_ObjRoToRi(p, pObj)) );
        else assert( Gia_ObjIsConst0(pObj) );
    }
    Vec_IntUniqify( vAssigned );
    return vAssigned;
}